

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall
HighsLpRelaxation::removeCuts
          (HighsLpRelaxation *this,HighsInt ndelcuts,vector<int,_std::allocator<int>_> *deletemask)

{
  value_type vVar1;
  undefined8 uVar2;
  HighsInt HVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  string *in_stack_00000028;
  HighsBasis *in_stack_00000030;
  Highs *in_stack_00000038;
  HighsInt i;
  HighsInt nlprows;
  HighsBasis basis;
  HighsBasis *this_00;
  Highs *this_01;
  HighsBasis *in_stack_ffffffffffffff08;
  HighsBasis *in_stack_ffffffffffffff10;
  undefined8 *puVar7;
  HighsInt mip_clock;
  Highs *this_02;
  allocator<char> local_b1;
  string local_b0 [40];
  HighsInt *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  string local_68 [56];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_30;
  vector<int,_std::allocator<int>_> *local_18;
  
  if (0 < in_ESI) {
    this_02 = (Highs *)(in_RDI + 1);
    local_18 = in_RDX;
    Highs::getBasis(this_02);
    HighsBasis::HighsBasis(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    HVar3 = Highs::getNumRow(this_02);
    puVar7 = in_RDI + 1;
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x606082);
    Highs::deleteRows((Highs *)CONCAT44(HVar3,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    for (local_b0._32_4_ = HighsMipSolver::numRow((HighsMipSolver *)*in_RDI);
        mip_clock = (HighsInt)((ulong)puVar7 >> 0x20), local_b0._32_4_ != HVar3;
        local_b0._32_4_ = local_b0._32_4_ + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (local_18,(long)(int)local_b0._32_4_);
      if (-1 < *pvVar4) {
        in_stack_ffffffffffffff10 =
             (HighsBasis *)
             std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
             operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                         *)(in_RDI + 0xa39),(long)(int)local_b0._32_4_);
        in_stack_ffffffffffffff08 = (HighsBasis *)(in_RDI + 0xa39);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_18,(long)(int)local_b0._32_4_);
        pvVar5 = std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
                 operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                             *)in_stack_ffffffffffffff08,(long)*pvVar4);
        uVar2._0_1_ = in_stack_ffffffffffffff10->valid;
        uVar2._1_1_ = in_stack_ffffffffffffff10->alien;
        uVar2._2_1_ = in_stack_ffffffffffffff10->useful;
        uVar2._3_1_ = in_stack_ffffffffffffff10->was_alien;
        uVar2._4_4_ = in_stack_ffffffffffffff10->debug_id;
        pvVar5->origin = (int)uVar2;
        pvVar5->index = (int)((ulong)uVar2 >> 0x20);
        pvVar5->age = in_stack_ffffffffffffff10->debug_update_count;
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_30,(long)(int)local_b0._32_4_);
        vVar1 = *pvVar6;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_18,(long)(int)local_b0._32_4_);
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_30,(long)*pvVar4);
        *pvVar6 = vVar1;
      }
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size(&local_30);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
    this_01 = (Highs *)(in_RDI + 0xa39);
    std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::size
              ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)
               this_01);
    std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::resize
              ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)
               in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
    std::__cxx11::string::operator=(local_68,"HighsLpRelaxation::removeCuts");
    this_00 = (HighsBasis *)&local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"",(allocator *)this_00);
    Highs::setBasis(in_stack_00000038,in_stack_00000030,in_stack_00000028);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    HighsMipAnalysis::mipTimerStart((HighsMipAnalysis *)this_02,mip_clock);
    Highs::run(this_01);
    HighsMipAnalysis::mipTimerStop((HighsMipAnalysis *)this_02,mip_clock);
    HighsBasis::~HighsBasis(this_00);
  }
  return;
}

Assistant:

void HighsLpRelaxation::removeCuts(HighsInt ndelcuts,
                                   std::vector<HighsInt>& deletemask) {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  if (ndelcuts > 0) {
    HighsBasis basis = lpsolver.getBasis();
    HighsInt nlprows = lpsolver.getNumRow();
    lpsolver.deleteRows(deletemask.data());
    for (HighsInt i = mipsolver.numRow(); i != nlprows; ++i) {
      if (deletemask[i] >= 0) {
        lprows[deletemask[i]] = lprows[i];
        basis.row_status[deletemask[i]] = basis.row_status[i];
      }
    }

    assert(lpsolver.getLp().num_row_ ==
           (HighsInt)lpsolver.getLp().row_lower_.size());

    basis.row_status.resize(basis.row_status.size() - ndelcuts);
    lprows.resize(lprows.size() - ndelcuts);

    assert(lpsolver.getLp().num_row_ == (HighsInt)lprows.size());
    basis.debug_origin_name = "HighsLpRelaxation::removeCuts";
    lpsolver.setBasis(basis);
    mipsolver.analysis_.mipTimerStart(kMipClockSimplexBasisSolveLp);
    lpsolver.run();
    mipsolver.analysis_.mipTimerStop(kMipClockSimplexBasisSolveLp);
  }
}